

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeWebAssemblyObject
               (DynamicObject *webAssemblyObject,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  DynamicObject *object;
  JavascriptFunction *ptr;
  RuntimeFunction *pRVar1;
  RuntimeFunction **ppRVar2;
  JavascriptString *value;
  DynamicObject *wabtObject;
  int slots;
  JavascriptLibrary *library;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *webAssemblyObject_local;
  
  this = RecyclableObject::GetLibrary(&webAssemblyObject->super_RecyclableObject);
  DeferredTypeHandlerBase::Convert(typeHandler,webAssemblyObject,mode,10,0);
  object = CreateObject(this,true,0);
  AddFunctionToLibraryObject
            (this,object,0xf3,(FunctionInfo *)WabtInterface::EntryInfo::ConvertWast2Wasm,1,'\x06');
  AddMember(this,webAssemblyObject,0xf2,object,'\0');
  ptr = AddFunctionToLibraryObject
                  (this,webAssemblyObject,0x19f,(FunctionInfo *)WebAssembly::EntryInfo::Compile,1,
                   '\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(&this->webAssemblyCompileFunction,ptr);
  AddFunctionToLibraryObject
            (this,webAssemblyObject,0xe1,(FunctionInfo *)WebAssembly::EntryInfo::CompileStreaming,1,
             '\x06');
  AddFunctionToLibraryObject
            (this,webAssemblyObject,0xe0,(FunctionInfo *)WebAssembly::EntryInfo::Validate,1,'\x06');
  AddFunctionToLibraryObject
            (this,webAssemblyObject,0xe2,(FunctionInfo *)WebAssembly::EntryInfo::Instantiate,1,
             '\x06');
  AddFunctionToLibraryObject
            (this,webAssemblyObject,0xe3,
             (FunctionInfo *)WebAssembly::EntryInfo::InstantiateStreaming,1,'\x06');
  pRVar1 = DefaultCreateFunction
                     (this,(FunctionInfo *)WebAssembly::EntryInfo::QueryResponse,1,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x186);
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=
            (&this->webAssemblyQueryResponseFunction,&pRVar1->super_JavascriptFunction);
  pRVar1 = DefaultCreateFunction
                     (this,(FunctionInfo *)WebAssembly::EntryInfo::InstantiateBound,1,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x186);
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=
            (&this->webAssemblyInstantiateBoundFunction,&pRVar1->super_JavascriptFunction);
  ppRVar2 = Memory::WriteBarrierPtr::operator_cast_to_RuntimeFunction__
                      ((WriteBarrierPtr *)&this->webAssemblyModuleConstructor);
  AddFunction(this,webAssemblyObject,0xd9,*ppRVar2);
  ppRVar2 = Memory::WriteBarrierPtr::operator_cast_to_RuntimeFunction__
                      ((WriteBarrierPtr *)&this->webAssemblyInstanceConstructor);
  AddFunction(this,webAssemblyObject,0xda,*ppRVar2);
  ppRVar2 = Memory::WriteBarrierPtr::operator_cast_to_RuntimeFunction__
                      ((WriteBarrierPtr *)&this->webAssemblyCompileErrorConstructor);
  AddFunction(this,webAssemblyObject,0xdd,*ppRVar2);
  ppRVar2 = Memory::WriteBarrierPtr::operator_cast_to_RuntimeFunction__
                      ((WriteBarrierPtr *)&this->webAssemblyRuntimeErrorConstructor);
  AddFunction(this,webAssemblyObject,0xde,*ppRVar2);
  ppRVar2 = Memory::WriteBarrierPtr::operator_cast_to_RuntimeFunction__
                      ((WriteBarrierPtr *)&this->webAssemblyLinkErrorConstructor);
  AddFunction(this,webAssemblyObject,0xdf,*ppRVar2);
  ppRVar2 = Memory::WriteBarrierPtr::operator_cast_to_RuntimeFunction__
                      ((WriteBarrierPtr *)&this->webAssemblyMemoryConstructor);
  AddFunction(this,webAssemblyObject,0xdb,*ppRVar2);
  ppRVar2 = Memory::WriteBarrierPtr::operator_cast_to_RuntimeFunction__
                      ((WriteBarrierPtr *)&this->webAssemblyTableConstructor);
  AddFunction(this,webAssemblyObject,0xdc,*ppRVar2);
  value = CreateStringFromCppLiteral<12ul>(this,(char16 (*) [12])0x1771f64);
  AddMember(this,webAssemblyObject,0x1b,value,'\x02');
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeWebAssemblyObject(DynamicObject* webAssemblyObject, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        JavascriptLibrary* library = webAssemblyObject->GetLibrary();
        int slots = 9;
#ifdef ENABLE_WABT
        // Attaching wabt for testing
        ++slots;
#endif
        typeHandler->Convert(webAssemblyObject, mode, slots);

#ifdef ENABLE_WABT
        // Build wabt object
        Js::DynamicObject* wabtObject = library->CreateObject(true);
        library->AddFunctionToLibraryObject(wabtObject, PropertyIds::convertWast2Wasm, &WabtInterface::EntryInfo::ConvertWast2Wasm, 1);
        library->AddMember(webAssemblyObject, PropertyIds::wabt, wabtObject, PropertyNone);
#endif
        library->webAssemblyCompileFunction =
            library->AddFunctionToLibraryObject(webAssemblyObject, PropertyIds::compile, &WebAssembly::EntryInfo::Compile, 1);
        library->AddFunctionToLibraryObject(webAssemblyObject, PropertyIds::compileStreaming, &WebAssembly::EntryInfo::CompileStreaming, 1);
        library->AddFunctionToLibraryObject(webAssemblyObject, PropertyIds::validate, &WebAssembly::EntryInfo::Validate, 1);
        library->AddFunctionToLibraryObject(webAssemblyObject, PropertyIds::instantiate, &WebAssembly::EntryInfo::Instantiate, 1);
        library->AddFunctionToLibraryObject(webAssemblyObject, PropertyIds::instantiateStreaming, &WebAssembly::EntryInfo::InstantiateStreaming, 1);
        library->webAssemblyQueryResponseFunction = library->DefaultCreateFunction(&WebAssembly::EntryInfo::QueryResponse, 1, nullptr, nullptr, PropertyIds::undefined);
        library->webAssemblyInstantiateBoundFunction = library->DefaultCreateFunction(&WebAssembly::EntryInfo::InstantiateBound, 1, nullptr, nullptr, PropertyIds::undefined);

        library->AddFunction(webAssemblyObject, PropertyIds::Module, library->webAssemblyModuleConstructor);

        library->AddFunction(webAssemblyObject, PropertyIds::Instance, library->webAssemblyInstanceConstructor);

        library->AddFunction(webAssemblyObject, PropertyIds::CompileError, library->webAssemblyCompileErrorConstructor);
        library->AddFunction(webAssemblyObject, PropertyIds::RuntimeError, library->webAssemblyRuntimeErrorConstructor);
        library->AddFunction(webAssemblyObject, PropertyIds::LinkError, library->webAssemblyLinkErrorConstructor);
        library->AddFunction(webAssemblyObject, PropertyIds::Memory, library->webAssemblyMemoryConstructor);
        library->AddFunction(webAssemblyObject, PropertyIds::Table, library->webAssemblyTableConstructor);

        library->AddMember(webAssemblyObject, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("WebAssembly")), PropertyConfigurable);

        return true;
    }